

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::calculateVertexPositions
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  bool bVar1;
  AnchorVertex **ppAVar2;
  AnchorData *base;
  qsizetype qVar3;
  const_reference __y;
  AnchorVertex *in_RDI;
  long in_FS_OFFSET;
  int i;
  AnchorData *edge;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *__range1;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> adjacents;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> pair;
  AnchorVertex *v;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> adjacentVertices;
  AnchorVertex *root;
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*> visited;
  QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  queue;
  undefined4 in_stack_fffffffffffffee8;
  Orientation in_stack_fffffffffffffeec;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *in_stack_fffffffffffffef0;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
  *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  QGraphicsAnchorLayoutPrivate *this_00;
  AnchorVertex *vertex;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_d0;
  AnchorVertex *in_stack_ffffffffffffff40;
  AnchorVertex *in_stack_ffffffffffffff48;
  qsizetype in_stack_ffffffffffffff50;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffff58;
  undefined1 local_98 [16];
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_88;
  AnchorVertex *local_78;
  AnchorVertex **local_70;
  const_iterator local_68;
  const_iterator local_60;
  undefined1 local_58 [16];
  QGraphicsLayoutItem *local_48;
  AnchorVertex *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  qreal local_8;
  
  local_8 = *(qreal *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  vertex = in_RDI;
  QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  ::QQueue((QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
            *)0x942219);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x942235);
  ppAVar2 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                      ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                       in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  local_30 = *ppAVar2;
  local_30->distance = 0.0;
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::insert
            ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),(AnchorVertex **)in_RDI);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QGraphicsLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
  QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>::
  operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
              *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::adjacentVertices
            (in_stack_fffffffffffffef8,vertex);
  this_00 = (QGraphicsAnchorLayoutPrivate *)local_58;
  local_60.i = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
  local_60 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::begin(in_stack_fffffffffffffef0);
  local_68.i = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end(in_stack_fffffffffffffef0);
  while( true ) {
    local_70 = local_68.i;
    bVar1 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator!=
                      (&local_60,local_68);
    if (!bVar1) break;
    ppAVar2 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator*(&local_60);
    local_78 = *ppAVar2;
    std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>::
    pair<QtGraphicsAnchorLayout::AnchorVertex_*&,_QtGraphicsAnchorLayout::AnchorVertex_*&,_true>
              (&local_88,&local_30,&local_78);
    QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
    ::enqueue((QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
               *)in_stack_fffffffffffffef0,
              (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
               *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator++(&local_60);
  }
  setupEdgesInterpolation
            (in_stack_ffffffffffffff58,(Orientation)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  while (bVar1 = QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                 ::isEmpty((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                            *)0x9423dc), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = (undefined1  [16])
               QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
               ::dequeue((QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                          *)0x942412);
    QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>::
    operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    base = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::edgeData
                     ((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                       *)in_stack_fffffffffffffef0,in_stack_ffffffffffffff48,
                      in_stack_ffffffffffffff40);
    bVar1 = QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::contains
                      ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffef0,
                       (AnchorVertex **)
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (!bVar1) {
      QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::insert
                ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                 CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (AnchorVertex **)in_RDI);
      interpolateEdge(this_00,(AnchorVertex *)base,
                      (AnchorData *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      in_stack_ffffffffffffff40 = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
      in_stack_ffffffffffffff48 = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
      QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
      ::operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                    *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
      adjacentVertices(in_stack_fffffffffffffef8,vertex);
      in_stack_ffffffffffffff0c = 0;
      while( true ) {
        in_stack_fffffffffffffef8 =
             (Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *)
             (long)in_stack_ffffffffffffff0c;
        qVar3 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::size
                          ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)&stack0xffffffffffffff40
                          );
        if (qVar3 <= (long)in_stack_fffffffffffffef8) break;
        QList<QtGraphicsAnchorLayout::AnchorVertex_*>::at
                  (in_stack_fffffffffffffef0,
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        bVar1 = QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::contains
                          ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffef0
                           ,(AnchorVertex **)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (!bVar1) {
          in_stack_fffffffffffffef0 =
               (QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)(local_98 + 8);
          __y = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::at
                          (in_stack_fffffffffffffef0,
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
          ::pair<QtGraphicsAnchorLayout::AnchorVertex_*&,_true>
                    (&local_d0,(AnchorVertex **)in_stack_fffffffffffffef0,__y);
          QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
          ::enqueue((QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                     *)in_stack_fffffffffffffef0,
                    (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                     *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        }
        in_stack_ffffffffffffff0c = in_stack_ffffffffffffff0c + 1;
      }
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
                ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x9425a7);
    }
  }
  QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x9425b9);
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::~QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x9425c6);
  QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  ::~QQueue((QQueue<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
             *)0x9425d3);
  if (*(qreal *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::calculateVertexPositions(Qt::Orientation orientation)
{
    QQueue<std::pair<AnchorVertex *, AnchorVertex *> > queue;
    QSet<AnchorVertex *> visited;

    // Get root vertex
    AnchorVertex *root = layoutFirstVertex[orientation];

    root->distance = 0;
    visited.insert(root);

    // Add initial edges to the queue
    const auto adjacentVertices = graph[orientation].adjacentVertices(root);
    for (AnchorVertex *v : adjacentVertices)
        queue.enqueue(std::pair(root, v));

    // Do initial calculation required by "interpolateEdge()"
    setupEdgesInterpolation(orientation);

    // Traverse the graph and calculate vertex positions
    while (!queue.isEmpty()) {
        std::pair<AnchorVertex *, AnchorVertex *> pair = queue.dequeue();
        AnchorData *edge = graph[orientation].edgeData(pair.first, pair.second);

        if (visited.contains(pair.second))
            continue;

        visited.insert(pair.second);
        interpolateEdge(pair.first, edge);

        QList<AnchorVertex *> adjacents = graph[orientation].adjacentVertices(pair.second);
        for (int i = 0; i < adjacents.size(); ++i) {
            if (!visited.contains(adjacents.at(i)))
                queue.enqueue(std::pair(pair.second, adjacents.at(i)));
        }
    }
}